

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::Printer::print_stacktrace<backward::StackTrace>
          (Printer *this,StackTrace *st,ostream *os,Colorize *colorize)

{
  ulong uVar1;
  ulong uVar2;
  size_t idx;
  Trace local_1a0;
  ResolvedTrace local_190;
  ResolvedTrace local_e0;
  
  print_header(this,os,(st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                       super_StackTraceImplHolder.super_StackTraceImplBase._thread_id);
  TraceResolverImplBase::load_stacktrace<backward::StackTrace>
            ((TraceResolverImplBase *)&this->_resolver,st);
  uVar2 = (st->super_StackTraceImpl<backward::system_tag::linux_tag>).super_StackTraceImplHolder.
          super_StackTraceImplBase._skip;
  uVar1 = (long)(st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                super_StackTraceImplHolder._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(st->super_StackTraceImpl<backward::system_tag::linux_tag>).
                super_StackTraceImplHolder._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3;
  if (uVar1 <= uVar2) {
    uVar2 = uVar1;
  }
  for (idx = ~uVar2 + uVar1; idx != 0xffffffffffffffff; idx = idx - 1) {
    local_1a0 = StackTraceImplHolder::operator[]((StackTraceImplHolder *)st,idx);
    ResolvedTrace::ResolvedTrace(&local_190,&local_1a0);
    TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::resolve
              (&local_e0,
               (TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *)
               &this->_resolver,&local_190);
    print_trace(this,os,&local_e0,colorize);
    ResolvedTrace::~ResolvedTrace(&local_e0);
    ResolvedTrace::~ResolvedTrace(&local_190);
  }
  return;
}

Assistant:

void print_stacktrace(ST &st, std::ostream &os, Colorize &colorize) {
    print_header(os, st.thread_id());
    _resolver.load_stacktrace(st);
    for (size_t trace_idx = st.size(); trace_idx > 0; --trace_idx) {
      print_trace(os, _resolver.resolve(st[trace_idx - 1]), colorize);
    }
  }